

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall BMP::writeFrequency(BMP *this,ofstream *out)

{
  anon_class_16_2_6278076d __f;
  bool local_19;
  ofstream *poStack_18;
  bool flag;
  ofstream *out_local;
  BMP *this_local;
  
  local_19 = out != (ofstream *)0x0;
  __f.out = &stack0xffffffffffffffe8;
  __f.flag = &local_19;
  poStack_18 = out;
  out_local = (ofstream *)this;
  std::for_each<bitMap::GreyCount*,BMP::writeFrequency(std::ofstream*)::__0>
            (this->alphabet->symbol,this->alphabet->symbol + this->alphabet->num,__f);
  return;
}

Assistant:

void BMP::writeFrequency( std::ofstream *out )
{
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    for_each(alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( bitMap::GreyCount a ){
        if ( flag ) {
            (*out) << setw( 8 ) << ( int ) a.tone << ": " << a.num << endl;
        } else {
            cout << setw( 8 ) << ( int ) a.tone << ": " << a.num << endl;
        }
    });
}